

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

void __thiscall
Messages::Person_PhoneNumber::Person_PhoneNumber(Person_PhoneNumber *this,Person_PhoneNumber *from)

{
  bool bVar1;
  undefined1 *this_00;
  Container<google::protobuf::UnknownFieldSet> *pCVar2;
  string *psVar3;
  string *value;
  Arena *arena;
  Person_PhoneNumber *from_local;
  Person_PhoneNumber *this_local;
  UnknownFieldSet *local_28;
  
  google::protobuf::Message::Message(&this->super_Message);
  *(undefined ***)this = &PTR__Person_PhoneNumber_0011bae8;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  this_00 = &from->field_0x8;
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    if (((uint)*(undefined8 *)this_00 & 1) == 1) {
      pCVar2 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                         ((InternalMetadata *)this_00);
      local_28 = &pCVar2->unknown_fields;
    }
    else {
      local_28 = (UnknownFieldSet *)(*(code *)0x0)();
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)&this->field_0x8,local_28);
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->number_,psVar3);
  bVar1 = _internal_has_number(from);
  if (bVar1) {
    psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    value = _internal_number_abi_cxx11_(from);
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    google::protobuf::internal::ArenaStringPtr::Set(&this->number_,psVar3,value,arena);
  }
  this->type_ = from->type_;
  return;
}

Assistant:

Person_PhoneNumber::Person_PhoneNumber(const Person_PhoneNumber& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  number_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_number()) {
    number_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_number(),
      GetArena());
  }
  type_ = from.type_;
  // @@protoc_insertion_point(copy_constructor:Messages.Person.PhoneNumber)
}